

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

int testing::internal::GetParamIndex(char **param_names,string *param_name)

{
  bool bVar1;
  int local_24;
  int i;
  string *param_name_local;
  char **param_names_local;
  
  bVar1 = std::operator==(param_name,"*");
  if (bVar1) {
    param_names_local._4_4_ = -1;
  }
  else {
    for (local_24 = 0; param_names[local_24] != (char *)0x0; local_24 = local_24 + 1) {
      bVar1 = std::operator==(param_name,param_names[local_24]);
      if (bVar1) {
        return local_24;
      }
    }
    param_names_local._4_4_ = -3;
  }
  return param_names_local._4_4_;
}

Assistant:

int GetParamIndex(const char* param_names[], const string& param_name) {
  if (param_name == "*")
    return kTupleInterpolation;

  for (int i = 0; param_names[i] != NULL; i++) {
    if (param_name == param_names[i])
      return i;
  }
  return kInvalidInterpolation;
}